

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_60;
  string local_40;
  
  Option<Catch::TestRunInfo>::operator=
            (&(this->super_StreamingReporterBase).currentTestRunInfo.
              super_Option<Catch::TestRunInfo>,testInfo);
  (this->super_StreamingReporterBase).currentTestRunInfo.used = false;
  (this->m_xml).m_os = (this->super_StreamingReporterBase).stream;
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Catch","");
  XmlWriter::startElement(&this->m_xml,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
    _vptr_NonCopyable[6])(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_60._M_string_length != 0) {
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"name","");
    (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[6])(&local_40);
    XmlWriter::writeAttribute(&this->m_xml,&local_60,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& testInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testRunStarting( testInfo );
            m_xml.setStream( stream );
            m_xml.startElement( "Catch" );
            if( !m_config->name().empty() )
                m_xml.writeAttribute( "name", m_config->name() );
        }